

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

int Extra_bddCheckUnateNaive(DdManager *dd,DdNode *bF,int iVar)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int local_34;
  int Res;
  DdNode *bCof1;
  DdNode *bCof0;
  int iVar_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  if (dd->size <= iVar) {
    __assert_fail("iVar < dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddUnate.c"
                  ,0x15a,"int Extra_bddCheckUnateNaive(DdManager *, DdNode *, int)");
  }
  pDVar2 = Cudd_bddIthVar(dd,iVar);
  pDVar2 = Cudd_Cofactor(dd,bF,(DdNode *)((ulong)pDVar2 ^ 1));
  Cudd_Ref(pDVar2);
  pDVar3 = Cudd_bddIthVar(dd,iVar);
  pDVar3 = Cudd_Cofactor(dd,bF,pDVar3);
  Cudd_Ref(pDVar3);
  iVar1 = Cudd_bddLeq(dd,pDVar2,pDVar3);
  if (iVar1 == 0) {
    iVar1 = Cudd_bddLeq(dd,pDVar3,pDVar2);
    if (iVar1 == 0) {
      local_34 = 0;
    }
    else {
      local_34 = -1;
    }
  }
  else {
    local_34 = 1;
  }
  Cudd_RecursiveDeref(dd,pDVar2);
  Cudd_RecursiveDeref(dd,pDVar3);
  return local_34;
}

Assistant:

int Extra_bddCheckUnateNaive( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  int iVar) 
{
    DdNode * bCof0, * bCof1;
    int Res;

    assert( iVar < dd->size );

    bCof0 = Cudd_Cofactor( dd, bF, Cudd_Not(Cudd_bddIthVar(dd,iVar)) );  Cudd_Ref( bCof0 );
    bCof1 = Cudd_Cofactor( dd, bF, Cudd_bddIthVar(dd,iVar) );            Cudd_Ref( bCof1 );

    if ( Cudd_bddLeq( dd, bCof0, bCof1 ) )
        Res = 1;
    else if ( Cudd_bddLeq( dd, bCof1, bCof0 ) )
        Res =-1;
    else
        Res = 0;

    Cudd_RecursiveDeref( dd, bCof0 );
    Cudd_RecursiveDeref( dd, bCof1 );
    return Res;
}